

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

void Aig_ManDupPartAll_rec(Aig_Man_t *pNew,Aig_Man_t *pOld,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  Aig_Obj_t *local_28;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pOld_local;
  Aig_Man_t *pNew_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                  ,0x429,"void Aig_ManDupPartAll_rec(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_ObjIsTravIdCurrent(pOld,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(pOld,pObj);
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsCo(pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pObj);
        if (iVar1 == 0) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                        ,0x436,"void Aig_ManDupPartAll_rec(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *)");
        }
        pAVar2 = Aig_ObjFanin0(pObj);
        Aig_ManDupPartAll_rec(pNew,pOld,pAVar2);
        pAVar2 = Aig_ObjFanin1(pObj);
        Aig_ManDupPartAll_rec(pNew,pOld,pAVar2);
        pAVar2 = Aig_ObjChild0Copy(pObj);
        p1 = Aig_ObjChild1Copy(pObj);
        local_28 = Aig_And(pNew,pAVar2,p1);
      }
      else {
        pAVar2 = Aig_ObjFanin0(pObj);
        Aig_ManDupPartAll_rec(pNew,pOld,pAVar2);
        pAVar2 = Aig_ObjChild0Copy(pObj);
        local_28 = Aig_ObjCreateCo(pNew,pAVar2);
      }
    }
    else {
      local_28 = Aig_ObjCreateCi(pNew);
    }
    (pObj->field_5).pData = local_28;
    (local_28->field_5).pData = pObj;
  }
  return;
}

Assistant:

void Aig_ManDupPartAll_rec( Aig_Man_t * pNew, Aig_Man_t * pOld, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjNew;
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsTravIdCurrent(pOld, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pOld, pObj);
    if ( Aig_ObjIsCi(pObj) )
        pObjNew = Aig_ObjCreateCi(pNew);
    else if ( Aig_ObjIsCo(pObj) )
    {
        Aig_ManDupPartAll_rec( pNew, pOld, Aig_ObjFanin0(pObj) );
        pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    else
    {
        assert( Aig_ObjIsNode(pObj) );
        Aig_ManDupPartAll_rec( pNew, pOld, Aig_ObjFanin0(pObj) );
        Aig_ManDupPartAll_rec( pNew, pOld, Aig_ObjFanin1(pObj) );
        pObjNew = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    }
    pObj->pData = pObjNew;
    pObjNew->pData = pObj;
}